

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O3

string * __thiscall
VariableStruct::OutputDef_abi_cxx11_(string *__return_storage_ptr__,VariableStruct *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VARTYPE VarType;
  size_type sVar2;
  pointer pcVar3;
  VariableStruct *pVVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  VarType = this->Type;
  if (this->Class == VARCLASS_CONST) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x12db6d);
  }
  OutputVarType_abi_cxx11_(&local_50,VarType);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  sVar2 = (this->Prefix)._M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (this->Prefix)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + sVar2);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  pVVar4 = (VariableStruct *)&this->CName;
  if ((this->CName)._M_string_length == 0) {
    pVVar4 = this;
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(pVVar4->BasicName)._M_dataplus._M_p);
  if (this->Type == VARTYPE_FIXSTR) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (this->Class == VARCLASS_FUNC) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else if ((this->Class == VARCLASS_ARRAY) &&
          (std::__cxx11::string::append((char *)__return_storage_ptr__), 1 < this->ParCount)) {
    iVar5 = 1;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->ParCount);
  }
  OutputVarInit_abi_cxx11_(&local_50,this->Class,this->Type);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->Output = 1;
  return __return_storage_ptr__;
}

Assistant:

std::string VariableStruct::OutputDef(void)
{
	//
	// Local Variables
	//
	std::string result;
	VARTYPE ActualType = Type;

	//
	// Output This Variable
	//
	switch (Class)
	{
	case VARCLASS_CONST:
		result = "const ";
		break;
	}

	result += OutputVarType(ActualType);
	result += " ";

	//
	// Pick a good name
	//
	if (Prefix.length() != 0)
	{
		result += Prefix + ".";
	}

	//
	// Pick a good name
	//
	if (CName.length() != 0)
	{
		result += CName;
	}
	else
	{
		result += BasicName;
	}

	switch(Type)
	{
	case VARTYPE_FIXSTR:
		result += "[]";
		break;
	}

	//
	// Add brackets if this is an array definition
	//
	switch (Class)
	{
	case VARCLASS_ARRAY:
		//
		// Default array dimension under Basic is 0..10
		// for most Basic's I've seen.
		//
		result += "[11]";
		for (int loop = 2; loop <= ParCount; loop++)
		{
			result += "[11]";
		}
		break;

	case VARCLASS_FUNC:
		result += "()";
		break;
	}

	result += OutputVarInit(Class, Type);

	//
	// Flag this one as having been output.
	//
	Output = true;
	return result;
}